

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaPrecision.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4>::iterate
          (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4> *this)

{
  int iVar1;
  deUint32 dVar2;
  deRoundingMode mode;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  void *pvVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  MessageBuilder local_1b08;
  undefined1 local_1987;
  char local_1986;
  char local_1985;
  GLfloat local_1984;
  GLboolean diffFmaStd;
  GLboolean diffCpuStd;
  GLfloat GStack_1980;
  GLboolean diffCpuFma;
  GLint stdTemp;
  GLint fmaTemp;
  GLint cpuTemp;
  int j_2;
  GLuint i_2;
  GLboolean rounding_mode_failed;
  GLuint roundingMode;
  GLfloat GStack_1960;
  GLboolean test_failed;
  FloatConverter stdU;
  FloatConverter fmaU;
  FloatConverter cpuU;
  GLfloat *resultsCPU [2];
  uint local_193c;
  uint local_1938;
  GLuint j_1;
  GLuint i_1;
  GLuint j;
  GLuint i;
  deRoundingMode previousRoundingMode;
  GLfloat resultCPURTZ [400];
  GLfloat resultCPURNE [400];
  GLfloat *resultTmp;
  GLfloat resultStd [400];
  GLfloat resultFma [400];
  Functions *gl;
  GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4> *this_local;
  long lVar4;
  
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x30))(0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBeginTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x112);
  (**(code **)(lVar4 + 0x538))(0,0,100);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x115);
  (**(code **)(lVar4 + 0x638))();
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x118);
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_vbo_result_fma_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x120);
  pvVar5 = (void *)(**(code **)(lVar4 + 0xd00))(0x8c8e,0,0x640,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x124);
  memcpy(resultStd + 0x18e,pvVar5,0x640);
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x129);
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_vbo_result_std_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,300);
  pvVar5 = (void *)(**(code **)(lVar4 + 0xd00))(0x8c8e,0,0x640,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x130);
  memcpy(&resultTmp,pvVar5,0x640);
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x135);
  mode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  for (i_1 = 0; i_1 < 100; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < 4; j_1 = j_1 + 1) {
      resultCPURTZ[(ulong)(i_1 * 4 + j_1) + 0x18e] =
           this->m_data_a[i_1 * 4 + j_1] * this->m_data_b[i_1 * 4 + j_1] +
           this->m_data_c[i_1 * 4 + j_1];
    }
  }
  deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
  for (local_1938 = 0; local_1938 < 100; local_1938 = local_1938 + 1) {
    for (local_193c = 0; local_193c < 4; local_193c = local_193c + 1) {
      (&i)[local_1938 * 4 + local_193c] =
           (GLuint)(this->m_data_a[local_1938 * 4 + local_193c] *
                    this->m_data_b[local_1938 * 4 + local_193c] +
                   this->m_data_c[local_1938 * 4 + local_193c]);
    }
  }
  deSetRoundingMode(mode);
  _fmaU = resultCPURTZ + 0x18e;
  resultsCPU[0] = (GLfloat *)&i;
  rounding_mode_failed = '\x01';
  i_2 = 0;
  do {
    if (rounding_mode_failed == '\0' || 1 < i_2) {
      if (rounding_mode_failed == '\0') {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1b08,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1b08,
                            (char (*) [101])
                            "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
                           );
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [37])"are not bitwise equal for i = 0..99\n");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1b08);
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      return STOP;
    }
    j_2._3_1_ = '\0';
    for (cpuTemp = 0; (uint)cpuTemp < 100; cpuTemp = cpuTemp + 1) {
      for (fmaTemp = 0; fmaTemp < 4; fmaTemp = fmaTemp + 1) {
        stdTemp = *(GLint *)(*(long *)(&fmaU + (ulong)i_2 * 2) +
                            (ulong)(uint)(cpuTemp * 4 + fmaTemp) * 4);
        GStack_1980 = resultStd[(ulong)(uint)(cpuTemp * 4 + fmaTemp) + 0x18e];
        local_1984 = resultStd[(ulong)(uint)(cpuTemp * 4 + fmaTemp) - 2];
        roundingMode = (GLuint)local_1984;
        GStack_1960 = GStack_1980;
        stdU.m_int = stdTemp;
        iVar1 = de::abs<int>(stdTemp - (int)GStack_1980);
        local_1985 = 2 < iVar1;
        iVar1 = de::abs<int>(stdTemp - (int)local_1984);
        local_1986 = 2 < iVar1;
        iVar1 = de::abs<int>((int)GStack_1980 - (int)local_1984);
        local_1987 = 2 < iVar1;
        if (((local_1985 != '\0') || (local_1986 != '\0')) || ((bool)local_1987)) {
          j_2._3_1_ = '\x01';
          break;
        }
      }
      if (j_2._3_1_ != '\0') break;
      rounding_mode_failed = '\0';
    }
    i_2 = i_2 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5FmaPrecision<S>::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");

	gl.drawArrays(GL_POINTS, 0, m_n_elements);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Retrieve the result data */
	glw::GLfloat		resultFma[m_n_elements * S];
	glw::GLfloat		resultStd[m_n_elements * S];
	const glw::GLfloat* resultTmp = DE_NULL;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_fma_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultFma, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_std_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultStd, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	/* Execute the algorithm from shader on CPU */
	glw::GLfloat resultCPURNE[m_n_elements * S];
	glw::GLfloat resultCPURTZ[m_n_elements * S];

	deRoundingMode previousRoundingMode = deGetRoundingMode();

	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURNE[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURTZ[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	/* Restore the rounding mode so subsequent tests aren't affected */
	deSetRoundingMode(previousRoundingMode);

	/* Check results */
	const glw::GLfloat* resultsCPU[] = { resultCPURNE, resultCPURTZ };
	FloatConverter		cpuU;
	FloatConverter		fmaU;
	FloatConverter		stdU;
	glw::GLboolean		test_failed = true;

	for (glw::GLuint roundingMode = 0; test_failed && roundingMode < 2; ++roundingMode)
	{
		glw::GLboolean rounding_mode_failed = false;
		for (glw::GLuint i = 0; i < m_n_elements; ++i)
		{
			for (int j = 0; j < S; ++j)
			{
				/* Assign float value to the union */
				cpuU.m_float = resultsCPU[roundingMode][i * S + j];
				fmaU.m_float = resultFma[i * S + j];
				stdU.m_float = resultStd[i * S + j];

				/* Convert float to int bitwise */
				glw::GLint cpuTemp = cpuU.m_int;
				glw::GLint fmaTemp = fmaU.m_int;
				glw::GLint stdTemp = stdU.m_int;

				glw::GLboolean diffCpuFma = de::abs(cpuTemp - fmaTemp) > 2;
				glw::GLboolean diffCpuStd = de::abs(cpuTemp - stdTemp) > 2;
				glw::GLboolean diffFmaStd = de::abs(fmaTemp - stdTemp) > 2;

				if (diffCpuFma || diffCpuStd || diffFmaStd)
				{
					rounding_mode_failed = true;
					break;
				}
			}

			if (rounding_mode_failed)
			{
				break;
			}
			else
			{
				test_failed = false;
			}
		} /* for (all elements) */
	}	 /* for (all rounding modes) */

	if (test_failed)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
			<< "are not bitwise equal for i = 0..99\n"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}